

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktx2check.cpp
# Opt level: O1

bool __thiscall
ktxValidator::validationContext::extractFormatInfo(validationContext *this,uint32_t *dfd)

{
  int iVar1;
  InterpretedDFDChannel a;
  InterpretedDFDChannel b;
  InterpretedDFDChannel g;
  InterpretedDFDChannel r;
  undefined1 local_20 [8];
  undefined1 local_18 [8];
  undefined1 local_10 [8];
  undefined1 local_8 [8];
  
  (this->formatInfo).blockDimension.x = (byte)dfd[4] + 1;
  (this->formatInfo).blockDimension.y = *(byte *)((long)dfd + 0x11) + 1;
  (this->formatInfo).blockDimension.z = *(byte *)((long)dfd + 0x12) + 1;
  (this->formatInfo).blockByteLength = (uint)(byte)dfd[5];
  if ((dfd[3] & 0x80) == 0) {
    (this->formatInfo).isBlockCompressed = false;
    iVar1 = interpretDFD(dfd,local_8,local_10,local_18,local_20,&(this->formatInfo).wordSize);
    if (0x200 < iVar1) {
      return false;
    }
  }
  else {
    (this->formatInfo).isBlockCompressed = true;
  }
  return true;
}

Assistant:

bool extractFormatInfo(uint32_t* dfd) {
            uint32_t* bdb = dfd + 1;
            struct formatInfo& fi = formatInfo;
            fi.blockDimension.x = KHR_DFDVAL(bdb, TEXELBLOCKDIMENSION0) + 1;
            fi.blockDimension.y = KHR_DFDVAL(bdb, TEXELBLOCKDIMENSION1) + 1;
            fi.blockDimension.z = KHR_DFDVAL(bdb, TEXELBLOCKDIMENSION2) + 1;
            fi.blockByteLength = KHR_DFDVAL(bdb, BYTESPLANE0);
            if (KHR_DFDVAL(bdb, MODEL) >= KHR_DF_MODEL_DXT1A) {
                // A block compressed format. Entire block is a single sample.
                fi.isBlockCompressed = true;
            } else {
                // An uncompressed format.
                InterpretedDFDChannel r, g, b, a;
                InterpretDFDResult result;

                fi.isBlockCompressed = false;
                result = interpretDFD(dfd, &r, &g, &b, &a, &fi.wordSize);
                if (result > i_UNSUPPORTED_ERROR_BIT)
                    return false;
            }
            return true;
        }